

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

void cali_set_global_double_byname(char *name,double val)

{
  allocator<char> local_69;
  double local_68;
  string local_60;
  Attribute attr;
  Caliper c;
  
  local_68 = val;
  cali::Caliper::Caliper(&c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,name,&local_69);
  attr = cali::Caliper::create_attribute
                   (&c,&local_60,CALI_TYPE_DOUBLE,0x640,0,(Attribute *)0x0,(Variant *)0x0);
  std::__cxx11::string::~string((string *)&local_60);
  local_60._M_dataplus._M_p = (pointer)0x6;
  local_60._M_string_length = (size_type)local_68;
  cali::Caliper::set(&c,&attr,(Variant *)&local_60);
  return;
}

Assistant:

void cali_set_global_double_byname(const char* name, double val)
{
    Caliper   c;
    Attribute attr =
        c.create_attribute(name, CALI_TYPE_DOUBLE, CALI_ATTR_GLOBAL | CALI_ATTR_UNALIGNED | CALI_ATTR_SKIP_EVENTS);

    // TODO: check for existing incompatible attribute key

    c.set(attr, cali_make_variant_from_double(val));
}